

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# striplog_unittest.cc
# Opt level: O1

int main(int param_1,char **argv)

{
  ostream *poVar1;
  char local_69;
  LogMessage local_68;
  
  signal(6,anon_unknown.dwarf_36f0::handle_abort);
  fLB::FLAGS_logtostderr = 1;
  google::InitGoogleLogging(*argv);
  if (fLB::FLAGS_check_mode == '\x01') {
    puts("dbg");
    return 0;
  }
  google::LogMessage::LogMessage
            (&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/striplog_unittest.cc"
             ,0x50);
  poVar1 = google::LogMessage::stream(&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TESTMESSAGE INFO",0x10);
  google::LogMessage::~LogMessage(&local_68);
  google::LogMessage::LogMessage
            (&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/striplog_unittest.cc"
             ,0x51,GLOG_WARNING);
  poVar1 = google::LogMessage::stream(&local_68);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"something",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TESTMESSAGE WARNING",0x13);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  local_69 = 'c';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_69,1);
  std::endl<char,std::char_traits<char>>(poVar1);
  google::LogMessage::~LogMessage(&local_68);
  google::LogMessage::LogMessage
            (&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/striplog_unittest.cc"
             ,0x53,ERROR);
  poVar1 = google::LogMessage::stream(&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TESTMESSAGE ERROR",0x11);
  google::LogMessage::~LogMessage(&local_68);
  google::LogMessage::LogMessage
            (&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/striplog_unittest.cc"
             ,0x55);
  poVar1 = google::LogMessage::stream(&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"TESTMESSAGE COND",0x10);
  google::LogMessage::~LogMessage(&local_68);
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/striplog_unittest.cc"
             ,0x56);
  poVar1 = google::LogMessage::stream(&local_68);
  std::operator<<(poVar1,"TESTMESSAGE FATAL");
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

int main(int, char* argv[]) {
#if defined(_MSC_VER)
  // Avoid presenting an interactive dialog that will cause the test to time
  // out.
  _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif  // defined(_MSC_VER)
  std::signal(SIGABRT, handle_abort);

  FLAGS_logtostderr = true;
  InitGoogleLogging(argv[0]);
  if (FLAGS_check_mode) {
    printf("%s\n", DEBUG_MODE ? "dbg" : "opt");
    return 0;
  }
  LOG(INFO) << "TESTMESSAGE INFO";
  LOG(WARNING) << 2 << "something"
               << "TESTMESSAGE WARNING" << 1 << 'c' << A() << std::endl;
  LOG(ERROR) << "TESTMESSAGE ERROR";
  bool flag = true;
  (flag ? LOG(INFO) : LOG(ERROR)) << "TESTMESSAGE COND";
  LOG(FATAL) << "TESTMESSAGE FATAL";
}